

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_extract_file_zstd_bcj_nobjc(char *refname)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *v2;
  time_t v2_00;
  la_int64_t v2_01;
  size_t s;
  unsigned_long uVar4;
  archive_entry *ae;
  char buff [4096];
  archive_entry *local_1040;
  undefined1 local_1038 [4104];
  
  extract_reference_file(refname);
  a = (archive_conflict *)archive_read_new();
  uVar4 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ƅ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ɔ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ƈ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,refname,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ɖ',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƍ',0x81fd,"(AE_IFREG | 0775)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2 = archive_entry_pathname(local_1040);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'Ǝ',"hw","\"hw\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  v2_00 = archive_entry_mtime(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ə',0x647cff18,"1685913368",v2_00,"archive_entry_mtime(ae)",(void *)0x0);
  v2_01 = archive_entry_size(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ɛ',0x3e50,"15952",v2_01,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ƒ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƒ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  while( true ) {
    s = archive_read_data((archive *)a,local_1038,0x1000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                     ,L'Ɩ',(uint)(-1 < (long)s),"bytes_read >= 0",(void *)0x0);
    if (s == 0) break;
    uVar4 = bitcrc32(uVar4 & 0xffffffff,local_1038,s);
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƚ',uVar4 & 0xffffffff,"computed_crc",0xbd66eebc,"expected_crc",(void *)0x0
                     );
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ɯ',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ɵ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ƣ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƣ',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ʀ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ƨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_extract_file_zstd_bcj_nobjc(const char *refname)
{
	struct archive_entry *ae;
	struct archive *a;
	char buff[4096];
	uint32_t computed_crc = 0;
	uint32_t expected_crc = 0xbd66eebc;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file: hw. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0775), archive_entry_mode(ae));
	assertEqualString("hw", archive_entry_pathname(ae));
	assertEqualInt(1685913368, archive_entry_mtime(ae));
	assertEqualInt(15952, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	for (;;) {
		la_ssize_t bytes_read = archive_read_data(a, buff, sizeof(buff));
		assert(bytes_read >= 0);
		if (bytes_read == 0) break;
		computed_crc = bitcrc32(computed_crc, buff, bytes_read);
	}
	assertEqualInt(computed_crc, expected_crc);

	assertEqualInt(1, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_7ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}